

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<myEmployeeCustomConstructor>::CallOut
          (ChValueSpecific<myEmployeeCustomConstructor> *this,ChArchiveOut *marchive)

{
  myEmployeeCustomConstructor *t;
  char *custom_name;
  ChNameValue<myEmployeeCustomConstructor> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChValueSpecific<myEmployeeCustomConstructor> *this_local;
  
  t = this->_ptr_to_val;
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  custom_name = (char *)std::__cxx11::string::c_str();
  make_ChNameValue<myEmployeeCustomConstructor>(&local_30,"*this->_ptr_to_val",t,custom_name,'\0');
  ChArchiveOut::out<myEmployeeCustomConstructor>(marchive,&local_30);
  ChNameValue<myEmployeeCustomConstructor>::~ChNameValue(&local_30);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}